

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyBlobSearch(void *pBlob,sxu32 nLen,void *pPattern,sxu32 pLen,sxu32 *pOfft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *zIn;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  void *pvVar13;
  int local_38;
  
  if (pLen <= nLen) {
    pcVar7 = (char *)((ulong)(nLen - pLen) + (long)pBlob);
    iVar1 = pLen - 1;
    iVar2 = pLen - 2;
    iVar3 = pLen - 3;
    pcVar9 = (char *)pBlob;
    do {
      bVar4 = true;
      pcVar12 = pcVar9;
      pcVar6 = (char *)pPattern;
      if (pLen != 0) {
        lVar11 = 0;
        pcVar6 = pcVar9;
        pvVar13 = pPattern;
        do {
          if (pcVar9[lVar11] != *(char *)((long)pPattern + lVar11)) {
            bVar4 = false;
            pcVar12 = pcVar9 + lVar11;
            pcVar6 = (char *)((long)pPattern + lVar11);
            goto LAB_00135d3a;
          }
          pcVar12 = pcVar6 + 1;
          iVar5 = (int)lVar11;
          if (iVar1 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 1);
            goto LAB_00135d3a;
          }
          if (pcVar9[lVar11 + 1] != *(char *)((long)pPattern + lVar11 + 1)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 1);
LAB_00135d38:
            bVar4 = false;
            goto LAB_00135d3a;
          }
          pcVar12 = pcVar6 + 2;
          if (iVar2 == iVar5) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 2);
            goto LAB_00135d3a;
          }
          if (pcVar9[lVar11 + 2] != *(char *)((long)pPattern + lVar11 + 2)) {
            pcVar6 = (char *)((long)pvVar13 + 2);
            goto LAB_00135d38;
          }
          pcVar12 = pcVar6 + 3;
          if (iVar3 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 3);
            goto LAB_00135d3a;
          }
          if (pcVar9[lVar11 + 3] != *(char *)((long)pPattern + lVar11 + 3)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 3);
            goto LAB_00135d38;
          }
          pcVar6 = pcVar6 + 4;
          pvVar13 = (void *)((long)pvVar13 + 4);
          lVar11 = lVar11 + 4;
        } while (pLen != (sxu32)lVar11);
        pcVar12 = pcVar6;
        pcVar6 = (char *)(lVar11 + (long)pPattern);
      }
LAB_00135d3a:
      pcVar10 = pcVar9;
      if ((bVar4) || (*pcVar12 == *pcVar6)) {
LAB_00135ff6:
        if (pOfft != (sxu32 *)0x0) {
          local_38 = (int)pBlob;
          *pOfft = (int)pcVar10 - local_38;
        }
        return 0;
      }
      pcVar10 = pcVar9 + 1;
      if (pcVar7 < pcVar10) {
        return -6;
      }
      bVar4 = true;
      pcVar6 = (char *)pPattern;
      pcVar12 = pcVar10;
      if (pLen != 0) {
        lVar11 = 0;
        pcVar8 = pcVar10;
        pvVar13 = pPattern;
        do {
          if (pcVar9[lVar11 + 1] != *(char *)((long)pPattern + lVar11)) {
            pcVar6 = (char *)((long)pPattern + lVar11);
            pcVar12 = pcVar9 + lVar11 + 1;
LAB_00135e11:
            bVar4 = false;
            goto LAB_00135e13;
          }
          pcVar12 = pcVar8 + 1;
          iVar5 = (int)lVar11;
          if (iVar1 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 1);
            goto LAB_00135e13;
          }
          if (pcVar9[lVar11 + 2] != *(char *)((long)pPattern + lVar11 + 1)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 1);
            goto LAB_00135e11;
          }
          pcVar12 = pcVar8 + 2;
          if (iVar2 == iVar5) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 2);
            goto LAB_00135e13;
          }
          if (pcVar9[lVar11 + 3] != *(char *)((long)pPattern + lVar11 + 2)) {
            pcVar6 = (char *)((long)pvVar13 + 2);
            goto LAB_00135e11;
          }
          pcVar12 = pcVar8 + 3;
          if (iVar3 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 3);
            goto LAB_00135e13;
          }
          if (pcVar9[lVar11 + 4] != *(char *)((long)pPattern + lVar11 + 3)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 3);
            goto LAB_00135e11;
          }
          pcVar8 = pcVar8 + 4;
          pvVar13 = (void *)((long)pvVar13 + 4);
          lVar11 = lVar11 + 4;
        } while (pLen != (sxu32)lVar11);
        pcVar6 = (char *)(lVar11 + (long)pPattern);
        pcVar12 = pcVar8;
      }
LAB_00135e13:
      if ((bVar4) || (*pcVar12 == *pcVar6)) goto LAB_00135ff6;
      pcVar10 = pcVar9 + 2;
      if (pcVar7 < pcVar10) {
        return -6;
      }
      bVar4 = true;
      pcVar6 = (char *)pPattern;
      pcVar12 = pcVar10;
      if (pLen != 0) {
        lVar11 = 0;
        pcVar8 = pcVar10;
        pvVar13 = pPattern;
        do {
          if (pcVar9[lVar11 + 2] != *(char *)((long)pPattern + lVar11)) {
            pcVar6 = (char *)((long)pPattern + lVar11);
            pcVar12 = pcVar9 + lVar11 + 2;
LAB_00135eec:
            bVar4 = false;
            goto LAB_00135eee;
          }
          pcVar12 = pcVar8 + 1;
          iVar5 = (int)lVar11;
          if (iVar1 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 1);
            goto LAB_00135eee;
          }
          if (pcVar9[lVar11 + 3] != *(char *)((long)pPattern + lVar11 + 1)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 1);
            goto LAB_00135eec;
          }
          pcVar12 = pcVar8 + 2;
          if (iVar2 == iVar5) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 2);
            goto LAB_00135eee;
          }
          if (pcVar9[lVar11 + 4] != *(char *)((long)pPattern + lVar11 + 2)) {
            pcVar6 = (char *)((long)pvVar13 + 2);
            goto LAB_00135eec;
          }
          pcVar12 = pcVar8 + 3;
          if (iVar3 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 3);
            goto LAB_00135eee;
          }
          if (pcVar9[lVar11 + 5] != *(char *)((long)pPattern + lVar11 + 3)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 3);
            goto LAB_00135eec;
          }
          pcVar8 = pcVar8 + 4;
          pvVar13 = (void *)((long)pvVar13 + 4);
          lVar11 = lVar11 + 4;
        } while (pLen != (sxu32)lVar11);
        pcVar6 = (char *)(lVar11 + (long)pPattern);
        pcVar12 = pcVar8;
      }
LAB_00135eee:
      if ((bVar4) || (*pcVar12 == *pcVar6)) goto LAB_00135ff6;
      pcVar10 = pcVar9 + 3;
      if (pcVar7 < pcVar10) {
        return -6;
      }
      bVar4 = true;
      pcVar6 = (char *)pPattern;
      pcVar12 = pcVar10;
      if (pLen != 0) {
        lVar11 = 0;
        pvVar13 = pPattern;
        pcVar8 = pcVar10;
        do {
          if (pcVar9[lVar11 + 3] != *(char *)((long)pPattern + lVar11)) {
            pcVar6 = (char *)((long)pPattern + lVar11);
            pcVar12 = pcVar9 + lVar11 + 3;
LAB_00135fca:
            bVar4 = false;
            goto LAB_00135fcc;
          }
          pcVar12 = pcVar8 + 1;
          iVar5 = (int)lVar11;
          if (iVar1 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 1);
            goto LAB_00135fcc;
          }
          if (pcVar9[lVar11 + 4] != *(char *)((long)pPattern + lVar11 + 1)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 1);
            goto LAB_00135fca;
          }
          pcVar12 = pcVar8 + 2;
          if (iVar2 == iVar5) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 2);
            goto LAB_00135fcc;
          }
          if (pcVar9[lVar11 + 5] != *(char *)((long)pPattern + lVar11 + 2)) {
            pcVar6 = (char *)((long)pvVar13 + 2);
            goto LAB_00135fca;
          }
          pcVar12 = pcVar8 + 3;
          if (iVar3 == iVar5) {
            pcVar6 = (char *)((long)pvVar13 + 3);
            goto LAB_00135fcc;
          }
          if (pcVar9[lVar11 + 6] != *(char *)((long)pPattern + lVar11 + 3)) {
            pcVar6 = (char *)((long)pPattern + lVar11 + 3);
            goto LAB_00135fca;
          }
          pcVar8 = pcVar8 + 4;
          pvVar13 = (void *)((long)pvVar13 + 4);
          lVar11 = lVar11 + 4;
        } while (pLen != (sxu32)lVar11);
        pcVar6 = (char *)(lVar11 + (long)pPattern);
        pcVar12 = pcVar8;
      }
LAB_00135fcc:
      if ((bVar4) || (*pcVar12 == *pcVar6)) goto LAB_00135ff6;
      pcVar9 = pcVar9 + 4;
    } while (pcVar9 <= pcVar7);
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobSearch(const void *pBlob, sxu32 nLen, const void *pPattern, sxu32 pLen, sxu32 *pOfft)
{
	const char *zIn = (const char *)pBlob;
	const char *zEnd;
	sxi32 rc;
	if( pLen > nLen ){
		return SXERR_NOTFOUND;
	}
	zEnd = &zIn[nLen-pLen];
	for(;;){
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}